

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O0

Literal * __thiscall
wasm::Literal::maxInt(Literal *__return_storage_ptr__,Literal *this,Literal *other)

{
  int32_t iVar1;
  int32_t iVar2;
  Literal *local_48;
  Literal *other_local;
  Literal *this_local;
  
  iVar1 = geti32(this);
  iVar2 = geti32(other);
  local_48 = other;
  if (iVar2 < iVar1) {
    local_48 = this;
  }
  Literal(__return_storage_ptr__,local_48);
  return __return_storage_ptr__;
}

Assistant:

Literal Literal::maxInt(const Literal& other) const {
  return geti32() > other.geti32() ? *this : other;
}